

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O0

void __thiscall
slang::ast::ValueExpressionBase::getLongestStaticPrefixesImpl
          (ValueExpressionBase *this,
          SmallVector<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>,_2UL>
          *results,Expression *longestStaticPrefix)

{
  bool bVar1;
  VariableSymbol *pVVar2;
  SmallVectorBase<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>_>
  *in_RSI;
  long in_RDI;
  pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*> *in_stack_ffffffffffffffb8;
  ValueSymbol *local_30;
  pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*> local_28;
  Expression *local_18;
  SmallVectorBase<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>_>
  *local_10;
  
  local_10 = in_RSI;
  bVar1 = VariableSymbol::isKind(**(SymbolKind **)(in_RDI + 0x30));
  if ((!bVar1) ||
     (pVVar2 = Symbol::as<slang::ast::VariableSymbol>((Symbol *)0xa1d4dc),
     pVVar2->lifetime != Automatic)) {
    local_30 = *(ValueSymbol **)(in_RDI + 0x30);
    std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>::
    pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*&,_true>
              (&local_28,&local_30,&local_18);
    SmallVectorBase<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>_>::
    push_back(local_10,in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

void ValueExpressionBase::getLongestStaticPrefixesImpl(
    SmallVector<std::pair<const ValueSymbol*, const Expression*>>& results,
    const Expression* longestStaticPrefix) const {

    // Automatic variables don't need to have drivers tracked.
    if (VariableSymbol::isKind(symbol.kind) &&
        symbol.as<VariableSymbol>().lifetime == VariableLifetime::Automatic) {
        return;
    }

    if (!longestStaticPrefix)
        longestStaticPrefix = this;
    results.push_back({&symbol, longestStaticPrefix});
}